

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O0

uint Js::JavascriptArray::GetFromIndex<unsigned_int>
               (Var arg,uint length,ScriptContext *scriptContext,bool addWithLength)

{
  bool bVar1;
  int64 iVar2;
  long *plVar3;
  double *pdVar4;
  uint local_54;
  double local_50;
  double local_48;
  long local_40 [2];
  double local_30;
  double value;
  uint fromIndex;
  bool addWithLength_local;
  ScriptContext *scriptContext_local;
  Var pvStack_10;
  uint length_local;
  Var arg_local;
  
  value._0_4_ = 0;
  value._7_1_ = addWithLength;
  _fromIndex = scriptContext;
  scriptContext_local._4_4_ = length;
  pvStack_10 = arg;
  bVar1 = TaggedInt::Is(arg);
  if (bVar1) {
    iVar2 = TaggedInt::ToInt64(pvStack_10);
    local_50 = (double)iVar2;
  }
  else {
    local_50 = JavascriptConversion::ToInteger(pvStack_10,_fromIndex);
  }
  local_30 = local_50;
  if (0.0 <= local_50) {
    local_48 = (double)scriptContext_local._4_4_;
    pdVar4 = min<double>(&local_30,&local_48);
    value._0_4_ = (uint)(long)*pdVar4;
  }
  else {
    if ((value._7_1_ & 1) == 0) {
      local_54 = 0;
    }
    else {
      local_40[1] = 0;
      local_40[0] = (long)(local_50 + (double)scriptContext_local._4_4_);
      plVar3 = max<long>(local_40 + 1,local_40);
      local_54 = (uint)*plVar3;
    }
    value._0_4_ = local_54;
  }
  return value._0_4_;
}

Assistant:

static T GetFromIndex(Var arg, T length, ScriptContext *scriptContext, bool addWithLength = true)
        {
            T fromIndex = 0;

            double value = TaggedInt::Is(arg) ? (double)TaggedInt::ToInt64(arg) : JavascriptConversion::ToInteger(arg, scriptContext);

            if (value < 0)
            {
                fromIndex = addWithLength ? (T)max(0i64, (int64)(value + length)) : 0;
            }
            else
            {
                fromIndex = (T)min(value, (double)length);
            }
            return fromIndex;
        }